

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavUtility.cpp
# Opt level: O0

string * __thiscall
WavParserHelper::GetAudioFormatTag_abi_cxx11_
          (string *__return_storage_ptr__,WavParserHelper *this,unsigned_short wFormatTag)

{
  short sVar1;
  unsigned_short wFormatTag_local;
  string *FormatTag;
  
  sVar1 = (short)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (sVar1 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_UNKNOWN");
  }
  else if (sVar1 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_PCM");
  }
  else if (sVar1 == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_ADPCM");
  }
  else if (sVar1 == 3) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_IEEE_FLOAT");
  }
  else if (sVar1 == 6) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_ALAW");
  }
  else if (sVar1 == 7) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_MULAW");
  }
  else if (sVar1 == -2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_EXTENSIBLE");
  }
  else if (sVar1 == -1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_DEVELOPMENT");
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"WAVE_FORMAT_UNKNOWN");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WavParserHelper::GetAudioFormatTag(unsigned short wFormatTag)
{
	std::string FormatTag;
	switch (wFormatTag)
	{
	case 0x0000:
		FormatTag = "WAVE_FORMAT_UNKNOWN";
		break;
	case 0x0001:
		FormatTag = "WAVE_FORMAT_PCM";
		break;
	case 0x0002:
		FormatTag = "WAVE_FORMAT_ADPCM";
		break;
	case 0x0003:
		FormatTag = "WAVE_FORMAT_IEEE_FLOAT";
		break;
	case 0x0006:
		FormatTag = "WAVE_FORMAT_ALAW";
		break;
	case 0x0007:
		FormatTag = "WAVE_FORMAT_MULAW";
		break;
	case 0xFFFE:
		FormatTag = "WAVE_FORMAT_EXTENSIBLE";
		break;
	case 0xFFFF:
		FormatTag = "WAVE_FORMAT_DEVELOPMENT";
		break;
	default:
		FormatTag = "WAVE_FORMAT_UNKNOWN";
	}

	return FormatTag;
}